

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_reflection_class.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::csharp::ReflectionClassGenerator::Generate
          (ReflectionClassGenerator *this,Printer *printer)

{
  long lVar1;
  Options *pOVar2;
  FileDescriptor *pFVar3;
  long lVar4;
  long lVar5;
  EnumGenerator enumGenerator;
  MessageGenerator local_80;
  
  WriteIntroduction(this,printer);
  WriteDescriptor(this,printer);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  pFVar3 = this->file_;
  if (0 < *(int *)(pFVar3 + 0x68)) {
    io::Printer::Print(printer,"#region Enums\n");
    pFVar3 = this->file_;
    if (0 < *(int *)(pFVar3 + 0x68)) {
      lVar5 = 0;
      lVar4 = 0;
      do {
        lVar1 = *(long *)(pFVar3 + 0x70);
        pOVar2 = SourceGeneratorBase::options(&this->super_SourceGeneratorBase);
        EnumGenerator::EnumGenerator
                  ((EnumGenerator *)&local_80,(EnumDescriptor *)(lVar1 + lVar5),pOVar2);
        EnumGenerator::Generate((EnumGenerator *)&local_80,printer);
        EnumGenerator::~EnumGenerator((EnumGenerator *)&local_80);
        lVar4 = lVar4 + 1;
        pFVar3 = this->file_;
        lVar5 = lVar5 + 0x38;
      } while (lVar4 < *(int *)(pFVar3 + 0x68));
    }
    io::Printer::Print(printer,"#endregion\n");
    io::Printer::Print(printer,"\n");
    pFVar3 = this->file_;
  }
  if (0 < *(int *)(pFVar3 + 0x58)) {
    io::Printer::Print(printer,"#region Messages\n");
    pFVar3 = this->file_;
    if (0 < *(int *)(pFVar3 + 0x58)) {
      lVar5 = 0;
      lVar4 = 0;
      do {
        lVar1 = *(long *)(pFVar3 + 0x60);
        pOVar2 = SourceGeneratorBase::options(&this->super_SourceGeneratorBase);
        MessageGenerator::MessageGenerator(&local_80,(Descriptor *)(lVar1 + lVar5),pOVar2);
        MessageGenerator::Generate(&local_80,printer);
        MessageGenerator::~MessageGenerator(&local_80);
        lVar4 = lVar4 + 1;
        pFVar3 = this->file_;
        lVar5 = lVar5 + 0xa8;
      } while (lVar4 < *(int *)(pFVar3 + 0x58));
    }
    io::Printer::Print(printer,"#endregion\n");
    io::Printer::Print(printer,"\n");
  }
  if ((this->namespace_)._M_string_length != 0) {
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n");
  }
  io::Printer::Print(printer,"\n");
  io::Printer::Print(printer,"#endregion Designer generated code\n");
  return;
}

Assistant:

void ReflectionClassGenerator::Generate(io::Printer* printer) {
  WriteIntroduction(printer);

  WriteDescriptor(printer);
  // Close the class declaration.
  printer->Outdent();
  printer->Print("}\n");

  // write children: Enums
  if (file_->enum_type_count() > 0) {
    printer->Print("#region Enums\n");
    for (int i = 0; i < file_->enum_type_count(); i++) {
      EnumGenerator enumGenerator(file_->enum_type(i), this->options());
      enumGenerator.Generate(printer);
    }
    printer->Print("#endregion\n");
    printer->Print("\n");
  }

  // write children: Messages
  if (file_->message_type_count() > 0) {
    printer->Print("#region Messages\n");
    for (int i = 0; i < file_->message_type_count(); i++) {
      MessageGenerator messageGenerator(file_->message_type(i), this->options());
      messageGenerator.Generate(printer);
    }
    printer->Print("#endregion\n");
    printer->Print("\n");
  }

  // TODO(jtattermusch): add insertion point for services.

  if (!namespace_.empty()) {
    printer->Outdent();
    printer->Print("}\n");
  }
  printer->Print("\n");
  printer->Print("#endregion Designer generated code\n");
}